

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  type tVar1;
  anon_class_40_3_03e05ccd *f;
  appender *paVar2;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_RCX;
  write_int_data<char> *in_RDX;
  basic_format_specs<char> *in_RSI;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_RDI;
  bool bVar3;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint prefix;
  uint abs_value;
  write_int_data<char> data;
  uint p;
  appender it;
  write_int_data<char> data_1;
  uint p_1;
  appender it_1;
  write_int_data<char> data_2;
  uint p_2;
  appender it_2;
  write_int_data<char> data_3;
  uint p_3;
  appender it_3;
  undefined4 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9c;
  char in_stack_fffffffffffffc9d;
  undefined1 in_stack_fffffffffffffc9e;
  char in_stack_fffffffffffffc9f;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  undefined8 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  locale_ref in_stack_fffffffffffffd10;
  uint local_290;
  uint32_t local_28c;
  write_int_data<char> *local_288;
  uint local_278;
  uint uStack_274;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_270;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_268;
  uint local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  buffer<char> *local_240;
  undefined8 local_238;
  undefined8 local_230;
  buffer<char> *local_228;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_220;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_218;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_210;
  undefined1 local_205;
  uint local_204;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_200;
  write_int_data<char> *local_1f8;
  uint local_1f0;
  int local_1ec;
  undefined8 local_1e8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_1e0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_1d8;
  uint local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  buffer<char> *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  buffer<char> *local_190;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_188;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_180;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_178;
  undefined1 local_16d;
  uint local_16c;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_168;
  write_int_data<char> *local_160;
  uint local_154;
  int local_150;
  undefined8 local_14c;
  undefined4 local_144;
  undefined8 local_13c;
  undefined4 local_134;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_130;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_128;
  uint local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  buffer<char> *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  buffer<char> *local_e8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_e0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_d8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_d0;
  undefined1 local_c5;
  uint local_c4;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_c0;
  write_int_data<char> *local_b8;
  uint local_b0;
  int local_ac;
  undefined8 local_a8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_a0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_98;
  uint local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  buffer<char> *local_70;
  undefined8 local_68;
  undefined8 local_60;
  buffer<char> *local_58;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_50;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_48;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_40;
  undefined1 local_35;
  uint local_34;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_30;
  write_int_data<char> *local_28;
  uint local_20;
  int local_1c;
  undefined8 local_18;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  local_278 = (uint)in_RSI;
  local_28c = local_278;
  uStack_274 = (uint)((ulong)in_RSI >> 0x20);
  local_290 = uStack_274;
  f = (anon_class_40_3_03e05ccd *)(ulong)(byte)in_RDX->padding;
  local_288 = in_RDX;
  local_270.container = in_RDI.container;
  switch(f) {
  case (anon_class_40_3_03e05ccd *)0x0:
  case (anon_class_40_3_03e05ccd *)0x1:
    if (((*(ushort *)((long)&in_RDX->padding + 1) >> 8 & 1) == 0) ||
       (bVar3 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                          ((appender *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                           ,CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           (uint)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                           (basic_format_specs<char> *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffd10), !bVar3)) {
      local_1ec = count_digits(local_28c);
      local_1e8 = CONCAT44(local_1ec,local_28c);
      local_1e0.container = local_270.container;
      local_1f0 = local_290;
      local_1f8 = local_288;
      if ((int)local_288->size == 0 && *(int *)((long)&local_288->size + 4) == -1) {
        tVar1 = to_unsigned<int>(0);
        paVar2 = reserve<fmt::v9::appender>
                           ((appender *)&local_1e0,(ulong)(tVar1 + (local_1f0 >> 0x18)));
        local_200.container =
             (paVar2->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container;
        if (local_1f0 != 0) {
          for (local_204 = local_1f0 & 0xffffff; local_204 != 0; local_204 = local_204 >> 8) {
            local_205 = (undefined1)local_204;
            local_210.container = (buffer<char> *)appender::operator++((appender *)&local_200,0);
            std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_210);
            std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                      ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)f,
                       (value_type *)
                       CONCAT17(in_stack_fffffffffffffc9f,
                                CONCAT16(in_stack_fffffffffffffc9e,
                                         CONCAT15(in_stack_fffffffffffffc9d,
                                                  CONCAT14(in_stack_fffffffffffffc9c,
                                                           in_stack_fffffffffffffc98)))));
          }
        }
        local_218.container = local_1e0.container;
        local_228 = local_200.container;
        local_220.container =
             (buffer<char> *)
             write_int<fmt::v9::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h:2065:41)>
             ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                       ((anon_class_8_2_0dfc6556_for_write_digits *)in_RSI,in_RDI.container);
        local_1d8.container =
             (buffer<char> *)
             base_iterator<fmt::v9::appender>(local_218.container,(appender)local_220.container);
      }
      else {
        write_int_data<char>::write_int_data
                  (in_RDX,(int)((ulong)in_RDI.container >> 0x20),(uint)in_RDI.container,in_RSI);
        local_240 = local_1e0.container;
        local_260 = local_1f0;
        local_258 = local_238;
        local_250 = local_230;
        local_248 = local_1e8;
        local_1d8.container =
             (buffer<char> *)
             write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_>
                       (in_RDI.container,in_RSI,in_RCX.container,(anon_class_32_3_03e05ccd *)f);
      }
      local_268.container = local_1d8.container;
    }
    else {
      local_268.container = local_270.container;
    }
    break;
  case (anon_class_40_3_03e05ccd *)0x2:
    local_1c = count_digits<3,unsigned_int>(local_278);
    if ((((*(ushort *)((long)&local_288->padding + 1) >> 7 & 1) != 0) &&
        (*(int *)((long)&local_288->size + 4) <= local_1c)) && (local_28c != 0)) {
      prefix_append(&local_290,0x30);
    }
    local_18 = CONCAT44(local_1c,local_28c);
    local_10.container = local_270.container;
    local_20 = local_290;
    local_28 = local_288;
    if ((int)local_288->size == 0 && *(int *)((long)&local_288->size + 4) == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v9::appender>((appender *)&local_10,(ulong)(tVar1 + (local_20 >> 0x18)))
      ;
      local_30.container =
           (paVar2->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container;
      if (local_20 != 0) {
        for (local_34 = local_20 & 0xffffff; local_34 != 0; local_34 = local_34 >> 8) {
          local_35 = (undefined1)local_34;
          local_40.container = (buffer<char> *)appender::operator++((appender *)&local_30,0);
          std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_40);
          std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)f,
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffc9f,
                              CONCAT16(in_stack_fffffffffffffc9e,
                                       CONCAT15(in_stack_fffffffffffffc9d,
                                                CONCAT14(in_stack_fffffffffffffc9c,
                                                         in_stack_fffffffffffffc98)))));
        }
      }
      local_48.container = local_10.container;
      local_58 = local_30.container;
      local_50.container =
           (buffer<char> *)
           write_int<fmt::v9::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h:2098:22)>
           ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                     ((anon_class_8_2_0dfc6556_for_write_digits *)f,in_RCX.container);
      local_8.container =
           (buffer<char> *)
           base_iterator<fmt::v9::appender>(local_48.container,(appender)local_50.container);
    }
    else {
      write_int_data<char>::write_int_data
                (in_RDX,(int)((ulong)in_RDI.container >> 0x20),(uint)in_RDI.container,in_RSI);
      local_70 = local_10.container;
      local_90 = local_20;
      local_88 = local_68;
      local_80 = local_60;
      local_78 = local_18;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_>
                     (in_RDI.container,in_RSI,in_RCX.container,(anon_class_32_3_03e05ccd *)f);
    }
    local_268.container = local_8.container;
    break;
  case (anon_class_40_3_03e05ccd *)0x3:
  case (anon_class_40_3_03e05ccd *)0x4:
    bVar3 = (char)in_RDX->padding == '\x04';
    if ((*(ushort *)((long)&in_RDX->padding + 1) >> 7 & 1) != 0) {
      in_stack_fffffffffffffc9e = 0x78;
      in_stack_fffffffffffffc9f = 'X';
      if (!bVar3) {
        in_stack_fffffffffffffc9f = 'x';
      }
      prefix_append(&local_290,(int)in_stack_fffffffffffffc9f << 8 | 0x30);
    }
    local_150 = count_digits<4,unsigned_int>(local_28c);
    local_14c = CONCAT44(local_150,local_28c);
    local_130.container = local_270.container;
    local_144 = CONCAT31(local_144._1_3_,bVar3);
    local_134 = local_144;
    local_154 = local_290;
    local_160 = local_288;
    local_13c = local_14c;
    if ((int)local_288->size == 0 && *(int *)((long)&local_288->size + 4) == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v9::appender>
                         ((appender *)&local_130,(ulong)(tVar1 + (local_154 >> 0x18)));
      local_168.container =
           (paVar2->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container;
      if (local_154 != 0) {
        for (local_16c = local_154 & 0xffffff; local_16c != 0; local_16c = local_16c >> 8) {
          local_16d = (undefined1)local_16c;
          local_178.container = (buffer<char> *)appender::operator++((appender *)&local_168,0);
          std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_178);
          std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)f,
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffc9f,
                              CONCAT16(in_stack_fffffffffffffc9e,
                                       CONCAT15(in_stack_fffffffffffffc9d,
                                                CONCAT14(in_stack_fffffffffffffc9c,
                                                         in_stack_fffffffffffffc98)))));
        }
      }
      local_180.container = local_130.container;
      local_190 = local_168.container;
      local_188.container =
           (buffer<char> *)
           write_int<fmt::v9::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h:2076:41)>
           ::anon_class_40_3_03e05ccd::anon_class_12_3_01816715_for_write_digits::operator()
                     ((anon_class_12_3_01816715_for_write_digits *)f,in_RCX.container);
      local_128.container =
           (buffer<char> *)
           base_iterator<fmt::v9::appender>(local_180.container,(appender)local_188.container);
    }
    else {
      write_int_data<char>::write_int_data
                (in_RDX,(int)((ulong)in_RDI.container >> 0x20),(uint)in_RDI.container,in_RSI);
      local_1a8 = local_130.container;
      local_1d0 = local_154;
      local_1c8 = local_1a0;
      local_1c0 = local_198;
      local_1b8 = local_13c;
      local_1b0 = (undefined1)local_134;
      local_128.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_>
                     (in_RDI.container,in_RSI,in_RCX.container,f);
    }
    local_268.container = local_128.container;
    break;
  case (anon_class_40_3_03e05ccd *)0x5:
  case (anon_class_40_3_03e05ccd *)0x6:
    if ((*(ushort *)((long)&in_RDX->padding + 1) >> 7 & 1) != 0) {
      in_stack_fffffffffffffc9c = 0x62;
      in_stack_fffffffffffffc9d = 'B';
      if ((char)in_RDX->padding != '\x06') {
        in_stack_fffffffffffffc9d = 'b';
      }
      prefix_append(&local_290,(int)in_stack_fffffffffffffc9d << 8 | 0x30);
    }
    local_ac = count_digits<1,unsigned_int>(local_28c);
    local_a8 = CONCAT44(local_ac,local_28c);
    local_a0.container = local_270.container;
    local_b0 = local_290;
    local_b8 = local_288;
    if ((int)local_288->size == 0 && *(int *)((long)&local_288->size + 4) == -1) {
      tVar1 = to_unsigned<int>(0);
      paVar2 = reserve<fmt::v9::appender>((appender *)&local_a0,(ulong)(tVar1 + (local_b0 >> 0x18)))
      ;
      local_c0.container =
           (paVar2->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container;
      if (local_b0 != 0) {
        for (local_c4 = local_b0 & 0xffffff; local_c4 != 0; local_c4 = local_c4 >> 8) {
          local_c5 = (undefined1)local_c4;
          local_d0.container = (buffer<char> *)appender::operator++((appender *)&local_c0,0);
          std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_d0);
          std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                    ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)f,
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffc9f,
                              CONCAT16(in_stack_fffffffffffffc9e,
                                       CONCAT15(in_stack_fffffffffffffc9d,
                                                CONCAT14(in_stack_fffffffffffffc9c,
                                                         in_stack_fffffffffffffc98)))));
        }
      }
      local_d8.container = local_a0.container;
      local_e8 = local_c0.container;
      local_e0.container =
           (buffer<char> *)
           write_int<fmt::v9::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h:2087:22)>
           ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                     ((anon_class_8_2_0dfc6556_for_write_digits *)f,in_RCX.container);
      local_98.container =
           (buffer<char> *)
           base_iterator<fmt::v9::appender>(local_d8.container,(appender)local_e0.container);
    }
    else {
      write_int_data<char>::write_int_data
                (in_RDX,(int)((ulong)in_RDI.container >> 0x20),(uint)in_RDI.container,in_RSI);
      local_100 = local_a0.container;
      local_120 = local_b0;
      local_118 = local_f8;
      local_110 = local_f0;
      local_108 = local_a8;
      local_98.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_>
                     (in_RDI.container,in_RSI,in_RCX.container,(anon_class_32_3_03e05ccd *)f);
    }
    local_268.container = local_98.container;
    break;
  default:
    throw_format_error((char *)in_RSI);
  case (anon_class_40_3_03e05ccd *)0xf:
    local_268.container =
         (buffer<char> *)
         write_char<char,fmt::v9::appender>
                   (in_RDI.container,(char)((ulong)in_RSI >> 0x38),in_RCX.container);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_268.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}